

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestList.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_3402a::TestAddingSecondTestAddsItToEndOfList::RunImpl
          (TestAddingSecondTestAddsItToEndOfList *this)

{
  TestResults *pTVar1;
  Test *pTVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  TestList list;
  Test test2;
  Test test1;
  TestDetails local_b0;
  TestList local_90;
  Test local_80;
  Test local_48;
  
  UnitTest::Test::Test(&local_48,"test1","DefaultSuite","",0);
  UnitTest::Test::Test(&local_80,"test2","DefaultSuite","",0);
  UnitTest::TestList::TestList(&local_90);
  UnitTest::TestList::Add(&local_90,&local_48);
  UnitTest::TestList::Add(&local_90,&local_80);
  pTVar2 = UnitTest::TestList::GetHead(&local_90);
  if (pTVar2 != &local_48) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x22);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_b0,"list.GetHead() == &test1");
  }
  if (local_48.next != &local_80) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x23);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_b0,"test1.next == &test2");
  }
  if (local_80.next != (Test *)0x0) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x24);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_b0,"test2.next == 0");
  }
  UnitTest::Test::~Test(&local_80);
  UnitTest::Test::~Test(&local_48);
  return;
}

Assistant:

TEST (AddingSecondTestAddsItToEndOfList)
{
    Test test1("test1");
    Test test2("test2");

    TestList list;
    list.Add(&test1);
    list.Add(&test2);

    CHECK (list.GetHead() == &test1);
    CHECK (test1.next == &test2);
    CHECK (test2.next == 0);
}